

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

int __thiscall CVmObjTads::has_finalizer(CVmObjTads *this,vm_obj_id_t self)

{
  int iVar1;
  undefined4 in_ESI;
  long *in_RDI;
  vm_obj_id_t srcobj;
  vm_val_t val;
  bool local_31;
  bool local_25;
  undefined1 local_24 [4];
  int local_20 [8];
  
  local_25 = false;
  if (G_predef_X.obj_destruct != 0) {
    iVar1 = (**(code **)(*in_RDI + 0x68))(in_RDI,G_predef_X.obj_destruct,local_20,in_ESI,local_24,0)
    ;
    local_25 = false;
    if (iVar1 != 0) {
      local_31 = true;
      if (((local_20[0] != 0xb) && (local_31 = true, local_20[0] != 0xe)) &&
         (local_31 = true, local_20[0] != 0x11)) {
        local_31 = local_20[0] == 0x12;
      }
      local_25 = local_31;
    }
  }
  return (int)local_25;
}

Assistant:

int CVmObjTads::has_finalizer(VMG_ vm_obj_id_t self)
{
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* 
     *   look up the finalization method - if it's defined, and it's a
     *   method, invoke it; otherwise do nothing 
     */
    return (G_predef->obj_destruct != VM_INVALID_PROP
            && get_prop(vmg_ G_predef->obj_destruct, &val, self, &srcobj, 0)
            && (val.typ == VM_CODEOFS
                || val.typ == VM_NATIVE_CODE
                || val.typ == VM_OBJX
                || val.typ == VM_BIFPTRX));
}